

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Session::Session(Session *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  uint32_t uVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar9;
  char *pcVar10;
  undefined **ppuVar11;
  unique_ptr<Catch::ColourImpl> colourImpl;
  unique_ptr<Catch::IStream> errStream;
  _func_int *local_d8;
  long *local_d0;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> local_c8;
  Parser local_a8;
  SourceLineInfo local_48;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  long *plVar8;
  
  (this->m_cli).super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00324f70;
  ppuVar11 = &PTR__ExeName_00323c80;
  (this->m_cli).m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (_func_int **)&PTR__ExeName_00323c80;
  local_38 = &(this->m_cli).m_exeName.m_name;
  (this->m_cli).m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  this_00 = &(this->m_cli).m_exeName.m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const(&)[13]>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_38,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8,(char (*) [13])"<executable>");
  *(undefined8 *)
   ((long)&(this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_configData).showSuccessfulTests = false;
  (this->m_configData).shouldDebugBreak = false;
  (this->m_configData).noThrow = false;
  (this->m_configData).showHelp = false;
  (this->m_configData).showInvisibles = false;
  (this->m_configData).filenamesAsTags = false;
  (this->m_configData).libIdentify = false;
  (this->m_configData).allowZeroTests = false;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_configData).abortAfter = -1;
  uVar5 = generateRandomSeed(Default);
  (this->m_configData).rngSeed = uVar5;
  (this->m_configData).shardCount = 1;
  (this->m_configData).shardIndex = 0;
  (this->m_configData).skipBenchmarks = false;
  (this->m_configData).benchmarkNoAnalysis = false;
  (this->m_configData).benchmarkSamples = 100;
  (this->m_configData).benchmarkConfidenceInterval = 0.95;
  (this->m_configData).benchmarkResamples = 100000;
  (this->m_configData).benchmarkWarmupTime = 100;
  (this->m_configData).verbosity = Normal;
  (this->m_configData).warnings = Nothing;
  (this->m_configData).showDurations = DefaultForReporter;
  (this->m_configData).minDuration = -1.0;
  (this->m_configData).runOrder = Declared;
  (this->m_configData).defaultColourMode = PlatformDefault;
  (this->m_configData).waitForKeypress = Never;
  (this->m_configData).defaultOutputFilename._M_dataplus._M_p =
       (pointer)&(this->m_configData).defaultOutputFilename.field_2;
  (this->m_configData).defaultOutputFilename._M_string_length = 0;
  (this->m_configData).defaultOutputFilename.field_2._M_local_buf[0] = '\0';
  (this->m_configData).name._M_dataplus._M_p = (pointer)&(this->m_configData).name.field_2;
  (this->m_configData).name._M_string_length = 0;
  (this->m_configData).name.field_2._M_local_buf[0] = '\0';
  (this->m_configData).processName._M_dataplus._M_p =
       (pointer)&(this->m_configData).processName.field_2;
  (this->m_configData).processName._M_string_length = 0;
  (this->m_configData).processName.field_2._M_local_buf[0] = '\0';
  this->m_startupExceptions = false;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_config).m_ptr = (Config *)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).reporterSpecifications.
  super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_c8);
    local_48.file =
         "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
    ;
    local_48.line = 0x476;
    operator<<((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               "Only one instance of Catch::Session can ever be used",0x34);
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_a8);
  }
  do {
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar7);
    plVar8 = (long *)CONCAT44(extraout_var,iVar6);
    if (*plVar8 == plVar8[1]) {
LAB_001443b1:
      Session()::alreadyInstantiated = '\x01';
      makeCommandLineParser(&local_a8,&this->m_configData);
      _Var3._M_pi = local_a8.m_exeName.m_name.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar2 = local_a8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_38->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar2;
      p_Var1 = this_00->_M_pi;
      this_00->_M_pi = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      _Var3._M_pi = local_a8.m_exeName.m_ref.
                    super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_a8.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_a8.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->m_cli).m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar4;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)&local_c8);
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_c8);
      local_a8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00324f70;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_a8.m_args);
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                (&local_a8.m_options);
      local_a8.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
      _vptr_ParserBase = (ParserBase)(ParserBase)ppuVar11;
      if (local_a8.m_exeName.m_ref.
          super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.m_exeName.m_ref.
                   super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_a8.m_exeName.m_name.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.m_exeName.m_name.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    config(this);
    if (Context::currentContext == (undefined8 *)0x0) {
      Context::currentContext = (undefined8 *)operator_new(0x10);
      *Context::currentContext = 0;
      Context::currentContext[1] = 0;
    }
    *Context::currentContext = (this->m_config).m_ptr;
    this->m_startupExceptions = true;
    local_a8.super_ParserBase._vptr_ParserBase = (_func_int **)&local_a8.m_exeName.m_name;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"%stderr","");
    makeStream((Catch *)&local_48,(string *)&local_a8);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_a8.super_ParserBase._vptr_ParserBase != &local_a8.m_exeName.m_name) {
      operator_delete(local_a8.super_ParserBase._vptr_ParserBase,
                      (ulong)((long)&((local_a8.m_exeName.m_name.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p + 1));
    }
    pcVar10 = local_48.file;
    makeColourImpl((Catch *)&local_d0,PlatformDefault,(IStream *)local_48.file);
    if (local_d0 == (long *)0x0) {
      pcVar10 = 
      "T *Catch::Detail::unique_ptr<Catch::ColourImpl>::operator->() [T = Catch::ColourImpl]";
LAB_001445c9:
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                    ,0x385,pcVar10);
    }
    if ((IStream *)pcVar10 == (IStream *)0x0) {
      pcVar10 = "T *Catch::Detail::unique_ptr<Catch::IStream>::operator->() [T = Catch::IStream]";
      goto LAB_001445c9;
    }
    iVar6 = (*(*(_func_int ***)pcVar10)[2])(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(extraout_var_00,iVar6),"Errors occurred during startup!",0x1f);
    local_a8.super_ParserBase._vptr_ParserBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(extraout_var_00,iVar6),(char *)&local_a8,1);
    ppuVar11 = (undefined **)*plVar8;
    if ((_func_int **)ppuVar11 == (_func_int **)plVar8[1]) {
      if (local_d0 != (long *)0x0) {
        (**(code **)(*local_d0 + 8))();
      }
      ppuVar11 = &PTR__ExeName_00323c80;
      if ((IStream *)local_48.file != (IStream *)0x0) {
        (*(*(_func_int ***)local_48.file)[1])();
      }
      goto LAB_001443b1;
    }
    local_d8 = (_func_int *)*ppuVar11;
    if (local_d8 != (_func_int *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    uVar9 = std::rethrow_exception((exception_ptr)&local_d8);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_a8.super_ParserBase._vptr_ParserBase != &local_a8.m_exeName.m_name) {
      operator_delete(local_a8.super_ParserBase._vptr_ParserBase,
                      (ulong)((long)&((local_a8.m_exeName.m_name.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p + 1));
    }
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_c8);
    __cxa_begin_catch(uVar9);
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    (*(pSVar7->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[7])
              (&(pSVar7->super_RegistryHub).super_IMutableRegistryHub);
    __cxa_end_catch();
  } while( true );
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }